

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
                 char **param_6)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  cmTarget *this;
  bool bVar3;
  char *value;
  iterator iVar4;
  iterator iVar5;
  char *value_00;
  ostream *poVar6;
  pointer ppcVar7;
  string *psVar8;
  bool bVar9;
  pair<bool,_const_char_*> pVar10;
  string report;
  string reportEntry;
  string interfaceProperty;
  ostringstream e;
  string local_240;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *local_220;
  char *local_218 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char *local_1d8;
  pointer local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_1d8 = defaultValue;
  value = cmTarget::GetProperty(tgt,p);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  *)tgt,p);
  p_Var1 = &(tgt->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  bVar9 = (_Rb_tree_header *)iVar4._M_node != p_Var1;
  bVar3 = cmTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (bVar9 && bVar3) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_220 = cmTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_240," * Target \"",(allocator *)&local_1a8);
    psVar2 = &tgt->Name;
    std::__cxx11::string::append((string *)&local_240);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      std::__cxx11::string::append((char *)&local_240);
      valueAsString<char_const*>((string *)&local_1a8,value);
      std::__cxx11::string::append((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_240);
    std::operator+(&local_1c8,"INTERFACE_",p);
    ppcVar7 = (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    while (ppcVar7 !=
           (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
      this = *ppcVar7;
      local_1d0 = ppcVar7;
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                      *)this,&local_1c8);
      value_00 = cmTarget::GetProperty(this,&local_1c8);
      local_1f8._M_string_length = 0;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8.field_2._M_local_buf[0] = '\0';
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(this->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        value_00 = value;
        if (bVar3) {
          value_00 = "";
        }
        if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
          value_00 = value;
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_1f8);
        psVar8 = &this->Name;
        std::__cxx11::string::append((string *)&local_1f8);
        std::__cxx11::string::append((char *)&local_1f8);
        valueAsString<char_const*>((string *)&local_1a8,value_00);
        std::__cxx11::string::append((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1f8);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
          if (bVar3) {
            pVar10 = consistentProperty<char_const*>("",value_00,t);
            std::__cxx11::string::append((string *)&local_240);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,pVar10.second != "");
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            value_00 = pVar10.second;
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar6 = std::operator<<(&local_1a8,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," on target \"");
              poVar6 = std::operator<<(poVar6,(string *)psVar2);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,local_1d8);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              poVar6 = std::operator<<(poVar6,(string *)psVar8);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              value = "";
              cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_00390cdc;
            }
          }
          else if (bVar9) {
            pVar10 = consistentProperty<char_const*>(value,value_00,t);
            std::__cxx11::string::append((string *)&local_240);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,value != pVar10.second);
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar6 = std::operator<<(&local_1a8,"The INTERFACE_");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property of \"");
              poVar6 = std::operator<<(poVar6,(string *)psVar8);
              poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," already determined\nfor \"");
              poVar6 = std::operator<<(poVar6,(string *)psVar2);
              std::operator<<(poVar6,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_00390cdc;
            }
            bVar9 = true;
            value_00 = pVar10.second;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a8,&local_1f8,"(Interface set)\n");
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            bVar9 = true;
          }
        }
        else {
          pVar10 = consistentProperty<char_const*>(value,value_00,t);
          std::__cxx11::string::append((string *)&local_240);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,value != pVar10.second);
          std::__cxx11::string::append((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_1a8);
          value_00 = pVar10.second;
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar6 = std::operator<<(&local_1a8,"Property ");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," on target \"");
            poVar6 = std::operator<<(poVar6,(string *)psVar2);
            poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
            poVar6 = std::operator<<(poVar6,(string *)psVar8);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00390cdc:
            std::__cxx11::string::~string((string *)local_218);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1f8);
            break;
          }
        }
      }
      value = value_00;
      std::__cxx11::string::~string((string *)&local_1f8);
      ppcVar7 = local_1d0 + 1;
    }
    valueAsString<char_const*>((string *)&local_1a8,value);
    compatibilityType_abi_cxx11_(&local_1f8,t);
    cmTarget::ReportPropertyOrigin(tgt,p,(string *)&local_1a8,&local_240,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_240);
  }
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}